

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Commands.h
# Opt level: O1

void LabelMission(int id)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  
  uVar1 = (ulong)(uint)id;
  pthread_mutex_lock((pthread_mutex_t *)&MissionFilesCS);
  if (missionfile == (FILE *)0x0 && bMissionRunning == 0) {
    pcVar4 = "Cannot use label outside a mission file.";
  }
  else {
    if ((uint)id < 0x400) {
      iVar3 = labels[uVar1];
      iVar2 = ftellline(missionfile);
      if (iVar3 < 1) {
        labels[uVar1] = iVar2;
        if (iVar2 < 1) {
          puts("File error.");
        }
      }
      else if (iVar3 != iVar2) {
        printf("Label %d already exists.\n",uVar1);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&MissionFilesCS);
      __stream = fopen("log/CurLbl.txt","w");
      if (__stream == (FILE *)0x0) {
        pcVar4 = "Unable to create current label file.";
      }
      else {
        iVar3 = fprintf(__stream,"%d",uVar1);
        if (iVar3 < 1) {
          puts("Error writing current label file.");
          fclose(__stream);
          return;
        }
        iVar3 = fclose(__stream);
        if (iVar3 == 0) {
          return;
        }
        pcVar4 = "Error closing current label file.";
      }
      puts(pcVar4);
      return;
    }
    pcVar4 = "Invalid parameter.";
  }
  puts(pcVar4);
  pthread_mutex_unlock((pthread_mutex_t *)&MissionFilesCS);
  return;
}

Assistant:

inline void LabelMission(int id)
{
	EnterCriticalSection(&MissionFilesCS);
	if ((!bMissionRunning)&&(!missionfile))
	{
		printf("Cannot use label outside a mission file.\n");
		LeaveCriticalSection(&MissionFilesCS);
		return;
	}
	if ((id < 0)||(id >= MAX_NB_LABELS))
	{
		printf("Invalid parameter.\n");
		LeaveCriticalSection(&MissionFilesCS);
		return;
	}
	// Labels are reset every time a new mission file is opened.
	if (labels[id] > 0) 
	{
		if (labels[id] != ftellline(missionfile))
		{
			printf("Label %d already exists.\n", id);
		}
	}
	else 
	{
		labels[id] = ftellline(missionfile);
		if (labels[id] <= 0)
		{
			printf("File error.\n");
		}
	}
	LeaveCriticalSection(&MissionFilesCS);
	SetCurrentLabelEx(LOG_FOLDER"CurLbl.txt", id);
}